

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

idx_t duckdb::UpdateStringStatistics
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  anon_struct_16_3_d7536bce_for_pointer aVar8;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        psVar3 = update->sel->sel_vector;
        iVar5 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar3[iVar6];
        }
        paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar2 + iVar5 * 0x10);
        StringStats::Update(&stats->statistics,(string_t *)&paVar1->pointer);
        if (0xc < *(uint *)(pdVar2 + iVar5 * 0x10)) {
          aVar8 = (anon_struct_16_3_d7536bce_for_pointer)
                  StringHeap::AddBlob(&segment->heap,(string_t *)&paVar1->pointer);
          paVar1->pointer = aVar8;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar6 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      iVar5 = 0;
      do {
        psVar3 = update->sel->sel_vector;
        iVar7 = iVar5;
        if (psVar3 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar3[iVar5];
        }
        puVar4 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
          sel->sel_vector[iVar6] = (sel_t)iVar5;
          iVar6 = iVar6 + 1;
          paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar2 + iVar7 * 0x10);
          StringStats::Update(&stats->statistics,(string_t *)&paVar1->pointer);
          if (0xc < *(uint *)(pdVar2 + iVar7 * 0x10)) {
            aVar8 = (anon_struct_16_3_d7536bce_for_pointer)
                    StringHeap::AddBlob(&segment->heap,(string_t *)&paVar1->pointer);
            paVar1->pointer = aVar8;
          }
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  return iVar6;
}

Assistant:

idx_t UpdateStringStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update, idx_t count,
                             SelectionVector &sel) {
	auto update_data = update.GetDataNoConst<string_t>(update);
	auto &mask = update.validity;
	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			auto &str = update_data[idx];
			StringStats::Update(stats.statistics, str);
			if (!str.IsInlined()) {
				update_data[idx] = segment->GetStringHeap().AddBlob(str);
			}
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				auto &str = update_data[idx];
				StringStats::Update(stats.statistics, str);
				if (!str.IsInlined()) {
					update_data[idx] = segment->GetStringHeap().AddBlob(str);
				}
			}
		}
		return not_null_count;
	}
}